

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O2

void __thiscall
crnlib::dxt1_endpoint_optimizer::compute_endpoint_component_errors
          (dxt1_endpoint_optimizer *this,uint comp_index,uint64 (*error) [4] [256],
          uint64 (*best_remaining_error) [4])

{
  uint uVar1;
  unique_color *puVar2;
  uchar *puVar3;
  uint64 uVar4;
  uint64 *puVar5;
  long lVar6;
  uint64 uVar7;
  uint8 s;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  uint64 (*pauVar11) [256];
  long lVar12;
  ulong uVar13;
  uint8 c;
  ulong uVar14;
  bool bVar15;
  ulong local_98 [6];
  uint64 WPP [4];
  uint64 WP2 [4];
  uint64 W [4];
  
  WPP[2] = 0;
  WPP[3] = 0;
  WPP[0] = 0;
  WPP[1] = 0;
  local_98[4] = 0;
  local_98[5] = 0;
  local_98[2] = 0;
  local_98[3] = 0;
  local_98[0] = 0;
  local_98[1] = 0;
  uVar1 = (this->m_unique_colors).m_size;
  puVar2 = (this->m_unique_colors).m_p;
  puVar3 = (this->m_best_solution).m_selectors.m_p;
  for (uVar8 = 0; uVar1 != uVar8; uVar8 = uVar8 + 1) {
    uVar9 = (ulong)puVar2[uVar8].m_color.field_0.c[comp_index];
    uVar14 = (ulong)puVar2[uVar8].m_weight;
    uVar13 = (ulong)puVar3[uVar8];
    WPP[uVar13 + 2] = WPP[uVar13 + 2] + uVar14;
    lVar6 = uVar14 * uVar9;
    local_98[uVar13 + 4] = local_98[uVar13 + 4] + lVar6 * 2;
    local_98[uVar13] = local_98[uVar13] + lVar6 * uVar9;
  }
  bVar15 = comp_index == 1;
  lVar6 = 0;
  pauVar11 = *error;
  for (; lVar6 != 2; lVar6 = lVar6 + 1) {
    uVar7 = local_98[lVar6];
    (*error)[lVar6][0] = uVar7;
    uVar4 = WPP[lVar6 + 2];
    uVar8 = local_98[lVar6 + 4];
    uVar13 = uVar7;
    for (uVar14 = 1; uVar14 < (ulong)bVar15 * 0x20 + 0x20; uVar14 = uVar14 + 1) {
      uVar9 = (ulong)(byte)((byte)uVar14 >> bVar15 * '\x02' + 2 | (byte)uVar14 << (bVar15 ^ 3U));
      uVar9 = (uVar4 * uVar9 - uVar8) * uVar9 + uVar7;
      (*(uint64 (*) [256])*pauVar11)[uVar14] = uVar9;
      if (uVar9 < uVar13) {
        uVar13 = uVar9;
      }
    }
    (*best_remaining_error)[lVar6] = uVar13;
    pauVar11 = pauVar11 + 1;
  }
  puVar5 = (*error)[2] + 1;
  for (lVar6 = 2; lVar6 != 4; lVar6 = lVar6 + 1) {
    uVar7 = local_98[lVar6];
    (*error)[lVar6][0] = uVar7;
    uVar4 = WPP[lVar6 + 2];
    uVar8 = (uVar4 - local_98[lVar6 + 4]) + uVar7;
    lVar10 = uVar4 * 3 - local_98[lVar6 + 4];
    for (lVar12 = 0; lVar12 != 0xff; lVar12 = lVar12 + 1) {
      if (uVar8 < uVar7) {
        uVar7 = uVar8;
      }
      puVar5[lVar12] = uVar8;
      uVar8 = uVar8 + lVar10;
      lVar10 = lVar10 + uVar4 * 2;
    }
    (*best_remaining_error)[lVar6] = uVar7;
    puVar5 = puVar5 + 0x100;
  }
  for (lVar6 = 0; lVar6 != -3; lVar6 = lVar6 + -1) {
    (*best_remaining_error)[(int)lVar6 + 2] =
         (*best_remaining_error)[(int)lVar6 + 2] + (*best_remaining_error)[lVar6 + 3];
  }
  return;
}

Assistant:

void dxt1_endpoint_optimizer::compute_endpoint_component_errors(uint comp_index, uint64 (&error)[4][256], uint64 (&best_remaining_error)[4])
    {
        uint64 W[4] = {}, WP2[4] = {}, WPP[4] = {};
        for (uint i = 0; i < m_unique_colors.size(); i++)
        {
            uint p = m_unique_colors[i].m_color[comp_index];
            uint w = m_unique_colors[i].m_weight;
            uint8 s = m_best_solution.m_selectors[i];
            W[s] += (int64)w;
            WP2[s] += (int64)w * p * 2;
            WPP[s] += (int64)w * p * p;
        }
        const uint comp_limit = comp_index == 1 ? 64 : 32;
        for (uint8 s = 0; s < 2; s++)
        {
            uint64 best_error = error[s][0] = WPP[s];
            for (uint8 c = 1; c < comp_limit; c++)
            {
                uint8 p = comp_index == 1 ? c << 2 | c >> 4 : c << 3 | c >> 2;
                error[s][c] = W[s] * p * p - WP2[s] * p + WPP[s];
                if (error[s][c] < best_error)
                {
                    best_error = error[s][c];
                }
            }
            best_remaining_error[s] = best_error;
        }
        for (uint8 s = 2; s < 4; s++)
        {
            uint64 best_error = error[s][0] = WPP[s], d = W[s] - WP2[s], dd = W[s] << 1, e = WPP[s] + d;
            for (uint p = 1; p < 256; p++, d += dd, e += d)
            {
                error[s][p] = e;
                if (e < best_error)
                {
                    best_error = e;
                }
            }
            best_remaining_error[s] = best_error;
        }
        for (uint8 s = 3; s; s--)
        {
            best_remaining_error[s - 1] += best_remaining_error[s];
        }
    }